

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeType.cpp
# Opt level: O3

ostream * sjtu::operator<<(ostream *output,timeType *obj)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [12];
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  char local_39;
  uint local_38;
  uint uStack_34;
  uint uStack_30;
  uint uStack_2c;
  
  uVar6 = -(uint)(obj->month < 10);
  uVar7 = -(uint)(obj->day < 10);
  uVar8 = -(uint)(obj->hour < 10);
  uVar9 = -(uint)(obj->minute < 10);
  if ((uVar6 & 1) == 0) {
    local_38 = uVar6;
    uStack_34 = uVar7;
    uStack_30 = uVar8;
    uStack_2c = uVar9;
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)output,obj->month);
    auVar2._4_4_ = uStack_34;
    auVar2._0_4_ = local_38;
    auVar2._8_4_ = uStack_30;
    auVar1._12_4_ = uStack_2c;
    auVar1._0_12_ = auVar2;
    if ((auVar1 & (undefined1  [16])0x100000000) == (undefined1  [16])0x0) {
      if ((auVar2 & (undefined1  [12])0x1) != (undefined1  [12])0x0) {
        if ((auVar1 & (undefined1  [16])0x100000000) == (undefined1  [16])0x0) {
          local_39 = '-';
          goto LAB_0011c2f8;
        }
        local_39 = '-';
        goto LAB_0011c128;
      }
      if ((auVar1 & (undefined1  [16])0x100000000) == (undefined1  [16])0x0) {
        local_39 = '-';
        goto LAB_0011c3a8;
      }
      local_39 = '-';
      goto LAB_0011c225;
    }
    if ((auVar2 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
      if ((auVar1 & (undefined1  [16])0x100000000) == (undefined1  [16])0x0) {
        local_39 = '-';
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_39,1);
        local_39 = '0';
        goto LAB_0011c3a8;
      }
      local_39 = '-';
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_39,1);
      local_39 = '0';
      goto LAB_0011c225;
    }
    if ((auVar1 & (undefined1  [16])0x100000000) == (undefined1  [16])0x0) {
      local_39 = '-';
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_39,1);
      local_39 = '0';
      goto LAB_0011c2f8;
    }
    local_39 = '-';
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_39,1);
    local_39 = '0';
LAB_0011c128:
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_39,1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,obj->day);
    pcVar5 = " 0";
    lVar4 = 2;
  }
  else {
    if ((uVar7 & 1) == 0) {
      if ((uVar8 & 1) == 0) {
        if ((uVar9 & 1) != 0) {
          local_39 = '0';
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>(output,&local_39,1);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,obj->month);
          local_39 = '-';
          goto LAB_0011c225;
        }
        local_39 = '0';
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>(output,&local_39,1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,obj->month);
        local_39 = '-';
LAB_0011c3a8:
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_39,1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,obj->day);
        pcVar5 = " ";
        lVar4 = 1;
      }
      else {
        if ((uVar9 & 1) != 0) {
          local_39 = '0';
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>(output,&local_39,1);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,obj->month);
          local_39 = '-';
          goto LAB_0011c128;
        }
        local_39 = '0';
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>(output,&local_39,1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,obj->month);
        local_39 = '-';
LAB_0011c2f8:
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_39,1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,obj->day);
        pcVar5 = " 0";
        lVar4 = 2;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,lVar4);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,obj->hour);
      pcVar5 = ":";
      lVar4 = 1;
      goto LAB_0011c3f3;
    }
    if ((uVar8 & 1) != 0) {
      if ((uVar9 & 1) == 0) {
        local_39 = '0';
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>(output,&local_39,1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,obj->month);
        local_39 = '-';
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_39,1);
        local_39 = '0';
        goto LAB_0011c2f8;
      }
      local_39 = '0';
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(output,&local_39,1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,obj->month);
      local_39 = '-';
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_39,1);
      local_39 = '0';
      goto LAB_0011c128;
    }
    if ((uVar9 & 1) == 0) {
      local_39 = '0';
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(output,&local_39,1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,obj->month);
      local_39 = '-';
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_39,1);
      local_39 = '0';
      goto LAB_0011c3a8;
    }
    local_39 = '0';
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(output,&local_39,1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,obj->month);
    local_39 = '-';
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_39,1);
    local_39 = '0';
LAB_0011c225:
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_39,1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,obj->day);
    pcVar5 = " ";
    lVar4 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,lVar4);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,obj->hour);
  pcVar5 = ":0";
  lVar4 = 2;
LAB_0011c3f3:
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,lVar4);
  std::ostream::operator<<((ostream *)poVar3,obj->minute);
  return output;
}

Assistant:

std::ostream &operator<<(std::ostream &output, const timeType &obj) {
            if (obj.month < 10) {
                if (obj.day < 10) {
                    if (obj.hour < 10) {
                        if (obj.minute < 10) output << '0' << obj.month << '-' << '0' << obj.day << " 0" << obj.hour << ":0" << obj.minute;
                        else output << '0' << obj.month << '-' << '0' << obj.day << " 0" << obj.hour << ":" << obj.minute;
                    }
                    else {
                        if (obj.minute < 10) output << '0' << obj.month << '-' << '0' << obj.day << " " << obj.hour << ":0" << obj.minute;
                        else output << '0' << obj.month << '-' << '0' << obj.day << " " << obj.hour << ":" << obj.minute;
                    }
                }
                else {
                    if (obj.hour < 10) {
                        if (obj.minute < 10) output << '0' << obj.month << '-' << obj.day << " 0" << obj.hour << ":0" << obj.minute;
                        else output << '0' << obj.month << '-' <<  obj.day << " 0" << obj.hour << ":" << obj.minute;
                    }
                    else {
                        if (obj.minute < 10) output << '0' << obj.month << '-' <<  obj.day << " " << obj.hour << ":0" << obj.minute;
                        else output << '0' << obj.month << '-' <<  obj.day << " " << obj.hour << ":" << obj.minute;
                    }
                }
            }
            else {
                if (obj.day < 10) {
                    if (obj.hour < 10) {
                        if (obj.minute < 10) output << obj.month << '-' << '0' << obj.day << " 0" << obj.hour << ":0" << obj.minute;
                        else output << obj.month << '-' << '0' << obj.day << " 0" << obj.hour << ":" << obj.minute;
                    }
                    else {
                        if (obj.minute < 10) output << obj.month << '-' << '0' << obj.day << " " << obj.hour << ":0" << obj.minute;
                        else output << obj.month << '-' << '0' << obj.day << " " << obj.hour << ":" << obj.minute;
                    }
                }
                else {
                    if (obj.hour < 10) {
                        if (obj.minute < 10) output << obj.month << '-' << obj.day << " 0" << obj.hour << ":0" << obj.minute;
                        else output << obj.month << '-' <<  obj.day << " 0" << obj.hour << ":" << obj.minute;
                    }
                    else {
                        if (obj.minute < 10) output << obj.month << '-' <<  obj.day << " " << obj.hour << ":0" << obj.minute;
                        else output << obj.month << '-' <<  obj.day << " " << obj.hour << ":" << obj.minute;
                    }
                }
            }
            return output;
        }